

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

void __thiscall
pbrt::
InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::reserve(InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,size_t n)

{
  size_t sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ulong in_RSI;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ra;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  int local_1c;
  
  sVar1 = capacity(in_RDI);
  if (sVar1 < in_RSI) {
    pbVar2 = pstd::pmr::polymorphic_allocator<std::__cxx11::string>::
             allocate_object<std::__cxx11::string>
                       ((polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8);
    for (local_1c = 0; (ulong)(long)local_1c < in_RDI->nStored; local_1c = local_1c + 1) {
      in_stack_ffffffffffffffd0 = pbVar2 + local_1c;
      begin(in_RDI);
      pstd::pmr::polymorphic_allocator<std::__cxx11::string>::
      construct<std::__cxx11::string,std::__cxx11::string>
                ((polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5230e6);
      begin(in_RDI);
      pstd::pmr::polymorphic_allocator<std::__cxx11::string>::destroy<std::__cxx11::string>
                ((polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
    pstd::pmr::polymorphic_allocator<std::__cxx11::string>::deallocate_object<std::__cxx11::string>
              ((polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x52312e);
    in_RDI->nAlloc = in_RSI;
    in_RDI->ptr = pbVar2;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (capacity() >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }